

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O0

void __thiscall Sealer::Sealer(Sealer *this)

{
  Sealer *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->trans_count = 0;
  std::__cxx11::string::string((string *)&this->merkle_root);
  std::__cxx11::string::operator=((string *)&this->merkle_root,anon_var_dwarf_21f85 + 0xc);
  return;
}

Assistant:

Sealer::Sealer() {
    merkle_root = "";
}